

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_handler.cpp
# Opt level: O0

void __thiscall ProtoHandler::OnDispatch(ProtoHandler *this,json *document)

{
  bool bVar1;
  MessageCMD MVar2;
  reference pvVar3;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_128;
  undefined1 local_118 [8];
  EvalParams params_4;
  undefined1 local_f0 [8];
  ActionParams params_3;
  undefined1 local_d0 [8];
  RemoveBreakpointParams params_2;
  undefined1 local_a0 [8];
  AddBreakpointParams params_1;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_68;
  undefined1 local_58 [8];
  InitParams params;
  json *document_local;
  ProtoHandler *this_local;
  
  params.ext.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)document;
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)document,"cmd");
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::is_number_integer(pvVar3);
  if (bVar1) {
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)document,"cmd");
    MVar2 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::get<MessageCMD,MessageCMD>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        *)pvVar3);
    switch(MVar2) {
    case InitReq:
      InitParams::InitParams((InitParams *)local_58);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&local_68,document);
      InitParams::Deserialize((InitParams *)local_58,&local_68);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_68);
      OnInitReq(this,(InitParams *)local_58);
      InitParams::~InitParams((InitParams *)local_58);
      break;
    default:
      break;
    case ReadyReq:
      OnReadyReq(this);
      break;
    case AddBreakPointReq:
      AddBreakpointParams::AddBreakpointParams((AddBreakpointParams *)local_a0);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&params_2.breakPoints.
                       super__Vector_base<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,document);
      AddBreakpointParams::Deserialize
                ((AddBreakpointParams *)local_a0,
                 (json *)&params_2.breakPoints.
                          super__Vector_base<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&params_2.breakPoints.
                        super__Vector_base<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      OnAddBreakPointReq(this,(AddBreakpointParams *)local_a0);
      AddBreakpointParams::~AddBreakpointParams((AddBreakpointParams *)local_a0);
      break;
    case RemoveBreakPointReq:
      RemoveBreakpointParams::RemoveBreakpointParams((RemoveBreakpointParams *)local_d0);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&params_3.action,document);
      RemoveBreakpointParams::Deserialize
                ((RemoveBreakpointParams *)local_d0,(json *)&params_3.action);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&params_3.action);
      OnRemoveBreakPointReq(this,(RemoveBreakpointParams *)local_d0);
      RemoveBreakpointParams::~RemoveBreakpointParams((RemoveBreakpointParams *)local_d0);
      break;
    case ActionReq:
      ActionParams::ActionParams((ActionParams *)local_f0);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&params_4.ctx.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,document);
      ActionParams::Deserialize
                ((ActionParams *)local_f0,
                 (json *)&params_4.ctx.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&params_4.ctx.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
      OnActionReq(this,(ActionParams *)local_f0);
      ActionParams::~ActionParams((ActionParams *)local_f0);
      break;
    case EvalReq:
      EvalParams::EvalParams((EvalParams *)local_118);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&local_128,document);
      EvalParams::Deserialize((EvalParams *)local_118,&local_128);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_128);
      OnEvalReq(this,(EvalParams *)local_118);
      EvalParams::~EvalParams((EvalParams *)local_118);
    }
  }
  return;
}

Assistant:

void ProtoHandler::OnDispatch(nlohmann::json document) {
	if (document["cmd"].is_number_integer()) {
		switch (document["cmd"].get<MessageCMD>()) {
			case MessageCMD::InitReq: {
				InitParams params;
				params.Deserialize(document);
				OnInitReq(params);
				break;
			}
			case MessageCMD::ReadyReq: {
				OnReadyReq();
				break;
			}
			case MessageCMD::AddBreakPointReq: {
				AddBreakpointParams params;
				params.Deserialize(document);
				OnAddBreakPointReq(params);
				break;
			}
			case MessageCMD::RemoveBreakPointReq: {
				RemoveBreakpointParams params;
				params.Deserialize(document);
				OnRemoveBreakPointReq(params);
				break;
			}
			case MessageCMD::ActionReq: {
				ActionParams params;
				params.Deserialize(document);
				OnActionReq(params);
				break;
			}
			case MessageCMD::EvalReq: {
				EvalParams params;
				params.Deserialize(document);
				OnEvalReq(params);
				break;
			}
			default:
				break;
		}
	}
}